

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
GetPropertyFromDescriptor<true>
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,SimpleDictionaryPropertyDescriptor<int> *descriptor,Var *value,
          PropertyValueInfo *info)

{
  BOOL BVar1;
  Var pvVar2;
  
  BVar1 = 0;
  if ((descriptor->Attributes & 8) == 0) {
    if (descriptor->propertyIndex == -1) {
      *value = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      pvVar2 = DynamicObject::GetSlot(instance,descriptor->propertyIndex);
      *value = pvVar2;
      SetPropertyValueInfo(this,info,&instance->super_RecyclableObject,descriptor);
    }
    BVar1 = 1;
  }
  return BVar1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyFromDescriptor(DynamicObject* instance, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var* value, PropertyValueInfo* info)
    {
        if (descriptor->Attributes & (PropertyDeleted | (allowLetConstGlobal ? 0 : PropertyLetConstGlobal)))
        {
            return false;
        }
        if (descriptor->propertyIndex != NoSlots)
        {
            *value = instance->GetSlot(descriptor->propertyIndex);
            SetPropertyValueInfo(info, instance, descriptor);
        }
        else
        {
            *value = instance->GetLibrary()->GetUndefined();
        }
        return true;
    }